

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ModuleEnumerator.cpp
# Opt level: O1

bool axl::sys::lnx::parseProcModulesFile<axl::sys::lnx::EnumeratorModulesParser>
               (EnumeratorModulesParser *parser)

{
  bool bVar1;
  int iVar2;
  ModuleState state;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  ulong size;
  ulong uVar6;
  undefined1 uVar7;
  char *pcVar8;
  char *pcVar9;
  File file;
  char *next;
  StringRef name;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  File local_ac;
  char *local_a8;
  undefined4 local_9c;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_98;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_78;
  ulong local_58;
  EnumeratorModulesParser *local_50;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_48;
  
  local_ac.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  local_98.m_length._0_1_ = 0;
  local_98.m_length._1_7_ = 0;
  local_98.m_isNullTerminated = false;
  local_98.m_p = (C *)0x0;
  local_98.m_hdr._0_1_ = 0;
  local_98.m_hdr._1_7_ = 0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr(&local_98,(BufHdr *)0x0);
  local_98.m_p = "/proc/modules";
  local_98.m_length._0_1_ = 0xd;
  local_98.m_length._1_7_ = 0;
  local_98.m_isNullTerminated = true;
  iVar2 = io::File::open(&local_ac,(char *)&local_98,1);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
  if ((char)iVar2 == '\0') {
    uVar7 = 0;
  }
  else {
    local_48.m_p = (char *)0x0;
    local_48.m_hdr = (Hdr *)0x0;
    local_48.m_count = 0;
    local_50 = parser;
    sVar3 = io::readFile((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_48,&local_ac);
    local_9c = (undefined4)CONCAT71((int7)(sVar3 >> 8),sVar3 != 0xffffffffffffffff);
    if ((sVar3 != 0xffffffffffffffff) && (0 < (long)local_48.m_count)) {
      pcVar9 = local_48.m_p + local_48.m_count;
      pcVar8 = local_48.m_p;
      do {
        while( true ) {
          pcVar4 = (char *)memchr(pcVar8,10,(long)pcVar9 - (long)pcVar8);
          if (pcVar4 == (char *)0x0) {
            pcVar4 = pcVar9;
          }
          pcVar5 = (char *)memchr(pcVar8,0x20,(long)pcVar4 - (long)pcVar8);
          local_a8 = pcVar5;
          if (pcVar5 == (char *)0x0) break;
          local_98.m_length._0_1_ = 0;
          local_98.m_length._1_7_ = 0;
          local_98.m_isNullTerminated = false;
          local_98.m_p = (C *)0x0;
          local_98.m_hdr._0_1_ = 0;
          local_98.m_hdr._1_7_ = 0;
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                    (&local_98,(BufHdr *)0x0);
          local_98.m_length._0_1_ = (undefined1)((long)pcVar5 - (long)pcVar8);
          local_98.m_length._1_7_ = (undefined7)((ulong)((long)pcVar5 - (long)pcVar8) >> 8);
          local_98.m_isNullTerminated = false;
          local_98.m_p = pcVar8;
          size = strtoul(pcVar5 + 1,&local_a8,0);
          bVar1 = true;
          if ((((local_a8 != pcVar5 + 1) && (*local_a8 == ' ')) &&
              (pcVar8 = local_a8 + 1, uVar6 = strtoul(pcVar8,&local_a8,0), local_a8 != pcVar8)) &&
             ((*local_a8 == ' ' &&
              (local_58 = uVar6,
              local_a8 = (char *)memchr(local_a8 + 1,0x20,(long)pcVar4 - (long)(local_a8 + 1)),
              local_a8 != (char *)0x0)))) {
            pcVar5 = local_a8 + 1;
            pcVar8 = (char *)memchr(pcVar5,0x20,(long)pcVar4 - (long)pcVar5);
            local_a8 = pcVar8;
            if (pcVar8 != (char *)0x0) {
              local_78.m_length._0_1_ = 0;
              local_78.m_length._1_7_ = 0;
              local_78.m_isNullTerminated = false;
              local_78.m_p = (C *)0x0;
              local_78.m_hdr._0_1_ = 0;
              local_78.m_hdr._1_7_ = 0;
              sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                        (&local_78,(BufHdr *)0x0);
              local_78.m_length._0_1_ = (undefined1)((long)pcVar8 - (long)pcVar5);
              local_78.m_length._1_7_ = (undefined7)((ulong)((long)pcVar8 - (long)pcVar5) >> 8);
              local_78.m_isNullTerminated = false;
              local_78.m_p = pcVar5;
              state = parseModuleState(&local_78);
              sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_78);
              if ((state != ModuleState_Unknown) &&
                 (uVar6 = strtoul(pcVar8 + 1,&local_a8,0), local_a8 != pcVar8 + 1)) {
                bVar1 = EnumeratorModulesParser::processModule
                                  (local_50,&local_98,size,local_58,state,uVar6);
              }
            }
          }
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
          pcVar8 = pcVar4 + 1;
          if ((bVar1 & pcVar8 < pcVar9) == 0) goto LAB_0014ee47;
        }
        pcVar8 = pcVar4 + 1;
      } while (pcVar8 < pcVar9);
    }
LAB_0014ee47:
    sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_48);
    uVar7 = (undefined1)local_9c;
  }
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_ac);
  return (bool)uVar7;
}

Assistant:

bool
parseProcModulesFile(Parser& parser) {
	io::File file;
	bool result = file.open("/proc/modules", io::FileFlag_ReadOnly);
	if (!result)
		return false;

	sl::Array<char> buffer;
	size_t size = io::readFile(&buffer, &file);
	if (size == -1)
		return false;

	const char* p = buffer.cp();
	const char* end = buffer.getEnd();
	const char* eol;

	for (; p < end; p = eol + 1) {
		eol = (char*)memchr(p, '\n', end - p);
		if (!eol)
			eol = end;

		char* next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		sl::StringRef name(p, next - p);
		if (!parser.checkModuleName(name))
			continue;

		p = next + 1;

		size_t size = strtoul(p, &next, 0);
		if (next == p || *next != ' ')
			continue;

		p = next + 1;
		size_t useCount = strtoul(p, &next, 0);
		if (next == p || *next != ' ')
			continue;

		p = next + 1;
		next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		p = next + 1;
		next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		ModuleState state = parseModuleState(sl::StringRef(p, next - p));
		if (!state)
			continue;

		p = next + 1;
		size_t offset = strtoul(p, &next, 0);
		if (next == p)
			continue;

		result = parser.processModule(name, size, useCount, state, offset);
		if (!result)
			break;
	}

	return true;
}